

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O0

EStatusCode __thiscall
AbstractContentContext::rg(AbstractContentContext *this,double inR,double inG,double inB)

{
  EStatusCode EVar1;
  PrimitiveObjectsWriter *this_00;
  allocator<char> local_49;
  string local_48;
  double local_28;
  double inB_local;
  double inG_local;
  double inR_local;
  AbstractContentContext *this_local;
  
  local_28 = inB;
  inB_local = inG;
  inG_local = inR;
  inR_local = (double)this;
  RenewStreamConnectAndStoreResult(this);
  AssertProcsetAvailable(this,&KProcsetPDF_abi_cxx11_);
  this_00 = &this->mPrimitiveWriter;
  PrimitiveObjectsWriter::WriteDouble(this_00,inG_local,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,inB_local,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,local_28,eTokenSeparatorSpace);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"rg",&local_49);
  PrimitiveObjectsWriter::WriteKeyword(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  EVar1 = GetCurrentStatusCode(this);
  return EVar1;
}

Assistant:

EStatusCode AbstractContentContext::rg(double inR,double inG,double inB)
{
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);

	mPrimitiveWriter.WriteDouble(inR);
	mPrimitiveWriter.WriteDouble(inG);
	mPrimitiveWriter.WriteDouble(inB);
	mPrimitiveWriter.WriteKeyword("rg");
	return GetCurrentStatusCode();
}